

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlValidatePushCData(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *local_58;
  undefined4 local_4c;
  undefined8 uStack_48;
  int len;
  xmlChar *data;
  PyObject *pyobj_ctxt;
  xmlValidCtxtPtr ctxt;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlValidatePushCData");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT
                      (py_retval,"Ozi:xmlValidatePushCData",&data,&stack0xffffffffffffffb8,&local_4c
                      );
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      if (data == &_Py_NoneStruct) {
        local_58 = (PyObject *)0x0;
      }
      else {
        local_58 = *(PyObject **)(data + 0x10);
      }
      pyobj_ctxt = local_58;
      ctxt._4_4_ = xmlValidatePushCData(local_58,uStack_48,local_4c);
      self_local = libxml_intWrap(ctxt._4_4_);
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlValidatePushCData(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    xmlValidCtxtPtr ctxt;
    PyObject *pyobj_ctxt;
    xmlChar * data;
    int len;

    if (libxml_deprecationWarning("xmlValidatePushCData") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"Ozi:xmlValidatePushCData", &pyobj_ctxt, &data, &len))
        return(NULL);
    ctxt = (xmlValidCtxtPtr) PyValidCtxt_Get(pyobj_ctxt);

    c_retval = xmlValidatePushCData(ctxt, data, len);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}